

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
glcts::LayoutBindingProgram::LayoutBindingProgram
          (LayoutBindingProgram *this,IProgramContextSupplier *contextSupplier)

{
  int iVar1;
  eStageType eVar2;
  undefined4 extraout_var;
  RenderContext *pRVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ShaderProgram *pSVar4;
  char *pcVar5;
  ProgramSources *sources;
  allocator<char> local_259;
  string local_258;
  ShaderSource local_238;
  ProgramSources local_210;
  undefined1 local_13a;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_115 [13];
  string local_108;
  ProgramSources local_e8;
  IProgramContextSupplier *local_18;
  IProgramContextSupplier *contextSupplier_local;
  LayoutBindingProgram *this_local;
  
  this->_vptr_LayoutBindingProgram = (_func_int **)&PTR__LayoutBindingProgram_0325c220;
  this->m_contextSupplier = contextSupplier;
  local_18 = contextSupplier;
  contextSupplier_local = (IProgramContextSupplier *)this;
  iVar1 = (*contextSupplier->_vptr_IProgramContextSupplier[2])();
  pRVar3 = deqp::Context::getRenderContext((Context *)CONCAT44(extraout_var,iVar1));
  this->m_context = pRVar3;
  eVar2 = (*local_18->_vptr_IProgramContextSupplier[4])();
  this->m_stage = eVar2;
  iVar1 = (*local_18->_vptr_IProgramContextSupplier[3])();
  this->m_testParams = (LayoutBindingParameters *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*local_18->_vptr_IProgramContextSupplier[2])();
  pRVar3 = deqp::Context::getRenderContext((Context *)CONCAT44(extraout_var_01,iVar1));
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  this->m_gl = (Functions *)CONCAT44(extraout_var_02,iVar1);
  iVar1 = (*this->_vptr_LayoutBindingProgram[2])();
  if (iVar1 == 2) {
    pSVar4 = (ShaderProgram *)operator_new(0xd0);
    pRVar3 = this->m_context;
    glu::ProgramSources::ProgramSources(&local_210);
    (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])(this->m_contextSupplier,2);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,pcVar5,&local_259);
    glu::ComputeSource::ComputeSource((ComputeSource *)&local_238,&local_258);
    sources = glu::ProgramSources::operator<<(&local_210,&local_238);
    glu::ShaderProgram::ShaderProgram(pSVar4,pRVar3,sources);
    this->m_program = pSVar4;
    glu::ComputeSource::~ComputeSource((ComputeSource *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    glu::ProgramSources::~ProgramSources(&local_210);
  }
  else {
    pSVar4 = (ShaderProgram *)operator_new(0xd0);
    local_13a = 1;
    pRVar3 = this->m_context;
    (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])(this->m_contextSupplier,0);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,pcVar5,local_115);
    (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])(this->m_contextSupplier,1);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,pcVar5,&local_139);
    glu::makeVtxFragSources(&local_e8,&local_108,&local_138);
    glu::ShaderProgram::ShaderProgram(pSVar4,pRVar3,&local_e8);
    local_13a = 0;
    this->m_program = pSVar4;
    glu::ProgramSources::~ProgramSources(&local_e8);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(local_115);
  }
  return;
}

Assistant:

LayoutBindingProgram(IProgramContextSupplier& contextSupplier)
		: m_contextSupplier(contextSupplier)
		, m_context(contextSupplier.getContext().getRenderContext())
		, m_stage(contextSupplier.getStage())
		, m_testParams(contextSupplier.getTestParameters())
		, m_gl(contextSupplier.getContext().getRenderContext().getFunctions())
	{
		if (getStage() != ComputeShader)
			m_program = new glu::ShaderProgram(
				m_context, glu::makeVtxFragSources(m_contextSupplier.getSource(VertexShader).c_str(),
												   m_contextSupplier.getSource(FragmentShader).c_str()));
		else
			m_program = new glu::ShaderProgram(
				m_context,
				glu::ProgramSources() << glu::ComputeSource(m_contextSupplier.getSource(ComputeShader).c_str()));
	}